

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

void __thiscall soul::heart::Parser::parseFunctionDecls(Parser *this,ScannedTopLevelItem *item)

{
  char *pcVar1;
  Module *pMVar2;
  size_t sVar3;
  pointer pUVar4;
  ulong uVar5;
  
  (this->module).object = item->module;
  pcVar1 = (item->moduleStartPos).data;
  if ((this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).input.data != pcVar1) {
    (this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    ).input.data = pcVar1;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    skip(&this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        );
  }
  pMVar2 = (this->module).object;
  if (pMVar2 != (Module *)0x0) {
    sVar3 = (pMVar2->functions).functions.numActive;
    if (sVar3 != (long)(item->functionParamCode).
                       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(item->functionParamCode).
                       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) {
      throwInternalCompilerError
                ("module->functions.size() == item.functionParamCode.size()","parseFunctionDecls",
                 0xe7);
    }
    if (sVar3 != (long)(item->functionBodyCode).
                       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(item->functionBodyCode).
                       super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) {
      throwInternalCompilerError
                ("module->functions.size() == item.functionBodyCode.size()","parseFunctionDecls",
                 0xe8);
    }
    pUVar4 = (item->functionParamCode).
             super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((item->functionParamCode).
        super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
        super__Vector_impl_data._M_finish != pUVar4) {
      uVar5 = 0;
      do {
        if ((this->
            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ).input.data != pUVar4[uVar5].data) {
          (this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ).input.data = pUVar4[uVar5].data;
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::skip(&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                );
        }
        pMVar2 = (this->module).object;
        if (pMVar2 == (Module *)0x0) goto LAB_0022e9e7;
        if ((pMVar2->functions).functions.numActive <= uVar5) {
          throwInternalCompilerError("index < numActive","operator[]",0x9f);
        }
        parseFunctionParams(this,(pMVar2->functions).functions.items[uVar5].object);
        uVar5 = uVar5 + 1;
        pUVar4 = (item->functionParamCode).
                 super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar5 < (ulong)((long)(item->functionParamCode).
                                     super__Vector_base<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar4 >> 3)
              );
    }
    (this->module).object = (Module *)0x0;
    return;
  }
LAB_0022e9e7:
  throwInternalCompilerError("object != nullptr","operator->",0x3c);
}

Assistant:

void parseFunctionDecls (ScannedTopLevelItem& item)
    {
        prepareToRescan (item);
        SOUL_ASSERT (module->functions.size() == item.functionParamCode.size());
        SOUL_ASSERT (module->functions.size() == item.functionBodyCode.size());

        for (size_t i = 0; i < item.functionParamCode.size(); ++i)
        {
            resetPosition (item.functionParamCode[i]);
            parseFunctionParams (module->functions.at (i));
        }

        module.reset();
    }